

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

char * TEST_parse_same_option_twice_with_unique(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int i;
  cargo_t cargo;
  int j;
  char *args [7];
  uint local_5c;
  cargo_t local_58;
  undefined1 local_4c [4];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  char *pcStack_20;
  char *local_18;
  
  iVar1 = cargo_init(&local_58,0,"program");
  if (iVar1 == 0) {
    local_18 = "2";
    local_28 = "4";
    pcStack_20 = "--alpha";
    local_38 = "1";
    pcStack_30 = "--beta";
    local_48 = 0x12aaaa;
    uStack_44 = 0;
    uStack_40 = 0x127dbd;
    uStack_3c = 0;
    iVar1 = cargo_add_option(local_58,CARGO_OPT_UNIQUE,"--alpha -a","The alpha","i",&local_5c);
    iVar2 = cargo_add_option(local_58,0,"--beta -b","The beta","i",local_4c);
    if (iVar2 == 0 && iVar1 == 0) {
      iVar1 = cargo_parse(local_58,0,1,7,(char **)&local_48);
      printf("--alpha == %d\n",(ulong)local_5c);
      if (iVar1 == 0) {
        pcVar3 = "Succesfully parsed duplicate option";
      }
      else {
        pcVar3 = (char *)0x0;
        if (local_5c != 1) {
          pcVar3 = "Expected --alpha to have value 1";
        }
      }
    }
    else {
      pcVar3 = "Failed to add options";
    }
    cargo_destroy(&local_58);
  }
  else {
    pcVar3 = "Failed to init cargo";
  }
  return pcVar3;
}

Assistant:

_TEST_START(TEST_parse_same_option_twice_with_unique)
{
    int i;
    int j;
    char *args[] = { "program", "--alpha", "1", "--beta", "4", "--alpha", "2" };

    ret |= cargo_add_option(cargo, CARGO_OPT_UNIQUE,
                                "--alpha -a", "The alpha", "i", &i);
    ret |= cargo_add_option(cargo, 0, "--beta -b", "The beta", "i", &j);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    printf("--alpha == %d\n", i);
    cargo_assert(ret != 0, "Succesfully parsed duplicate option");
    cargo_assert(i == 1, "Expected --alpha to have value 1");

    _TEST_CLEANUP();
}